

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded
          (CumulativeReporterBase<Catch::JunitReporter> *this,TestCaseStats *testCaseStats)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined1 local_28 [8];
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  node;
  TestCaseStats *testCaseStats_local;
  CumulativeReporterBase<Catch::JunitReporter> *this_local;
  
  node.
  super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)testCaseStats;
  std::
  make_shared<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,Catch::TestCaseStats_const&>
            ((TestCaseStats *)local_28);
  sVar3 = clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
          ::size(&this->m_sectionStack);
  if (sVar3 != 0) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp"
                  ,0x1725,
                  "virtual void Catch::CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded(const TestCaseStats &) [DerivedT = Catch::JunitReporter]"
                 );
  }
  peVar4 = clara::std::
           __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::push_back(&peVar4->children,&this->m_rootSection);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  ::push_back(&this->m_testCases,(value_type *)local_28);
  clara::std::
  __shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  ::reset(&(this->m_rootSection).
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
         );
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_deepestSection);
  if (!bVar2) {
    __assert_fail("m_deepestSection",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp"
                  ,0x172a,
                  "virtual void Catch::CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded(const TestCaseStats &) [DerivedT = Catch::JunitReporter]"
                 );
  }
  p_Var1 = node.
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 0xe;
  peVar5 = clara::std::
           __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_deepestSection);
  std::__cxx11::string::operator=((string *)&peVar5->stdOut,(string *)&p_Var1->_M_use_count);
  p_Var1 = node.
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 0x10;
  peVar5 = clara::std::
           __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_deepestSection);
  std::__cxx11::string::operator=((string *)&peVar5->stdErr,(string *)&p_Var1->_M_use_count);
  clara::std::
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  ::~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
                 *)local_28);
  return;
}

Assistant:

void testCaseEnded(TestCaseStats const& testCaseStats) override {
            auto node = std::make_shared<TestCaseNode>(testCaseStats);
            assert(m_sectionStack.size() == 0);
            node->children.push_back(m_rootSection);
            m_testCases.push_back(node);
            m_rootSection.reset();

            assert(m_deepestSection);
            m_deepestSection->stdOut = testCaseStats.stdOut;
            m_deepestSection->stdErr = testCaseStats.stdErr;
        }